

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O2

ssize_t nettlp_pcie_cfg_write(nettlp_pcie_cfg *ntpc,uint16_t addr,void *buf,size_t count)

{
  byte bVar1;
  ssize_t sVar2;
  int iVar3;
  ulong uVar4;
  short sVar5;
  uint uVar6;
  int iVar7;
  undefined6 in_register_00000032;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  uint32_t data;
  byte local_62;
  undefined1 local_61;
  uint local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  int local_50;
  uint local_4c;
  ulong local_48;
  nettlp_pcie_cfg *local_40;
  ulong local_38;
  
  uVar6 = (uint)CONCAT62(in_register_00000032,addr);
  uVar8 = (int)count + uVar6;
  local_4c = uVar8 & 3;
  local_50 = 4 - local_4c;
  uVar10 = CONCAT62(in_register_00000032,addr) >> 2 & 0x3fffffff;
  local_48 = (ulong)CONCAT22((ushort)(uVar8 >> 0x12),(short)(uVar8 >> 2) - (ushort)(local_4c == 0));
  uVar6 = uVar6 & 3;
  local_38 = (ulong)uVar6;
  local_54 = 4 - uVar6;
  local_58 = (uint)((byte)(0xf << (sbyte)uVar6) & 0xe);
  local_5c = 0xfU >> ((byte)local_50 & 0x1f) & 0xff;
  sVar5 = 0;
  iVar9 = 0;
  local_40 = ntpc;
  while( true ) {
    iVar3 = iVar9;
    if ((ushort)local_48 < (ushort)uVar10) break;
    bVar12 = local_38 != 0;
    data = 0;
    bVar11 = sVar5 == 0;
    sVar5 = sVar5 + -1;
    uVar6 = 0xf;
    if (bVar12 && bVar11) {
      uVar6 = local_58;
    }
    uVar4 = 0;
    if (bVar12 && bVar11) {
      uVar4 = local_38;
    }
    iVar7 = 4;
    if (bVar12 && bVar11) {
      iVar7 = local_54;
    }
    iVar3 = local_50;
    bVar1 = (byte)local_5c;
    if ((ushort)local_48 != (ushort)uVar10 || local_4c == 0) {
      iVar3 = 0;
      bVar1 = 0xef;
    }
    iVar7 = iVar7 - iVar3;
    memcpy((void *)((long)&data + uVar4),buf,(long)iVar7);
    local_62 = (byte)(uVar10 >> 8) & 3 | (bVar1 & (byte)uVar6) << 2 | 0x40;
    local_61 = (undefined1)uVar10;
    local_60 = data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
    sVar2 = write(local_40->sockfd,&local_62,6);
    iVar3 = (int)sVar2;
    if ((int)sVar2 < 0) break;
    buf = (void *)((long)buf + (long)iVar7);
    iVar9 = iVar7 + iVar9;
    uVar10 = (ulong)((int)uVar10 + 1);
  }
  return (long)iVar3;
}

Assistant:

ssize_t nettlp_pcie_cfg_write(struct nettlp_pcie_cfg *ntpc, uint16_t addr,
			      void *buf, size_t count)
{
	int ret;
	uint16_t dwaddr;
	uint8_t mask;
	uint32_t data;
	uint8_t *ptr;

	int len, written = 0;
	uint16_t start_dwaddr, end_dwaddr;
	int fstpad;	/* unnecessary bytes in first DWORD */
	int lstpad;	/* unnecessary bytes in last DWORD */

	fstpad = addr & 0x0003;
	lstpad = 4 - ((addr + count) & 0x0003);

	start_dwaddr = addr >> 2;
	end_dwaddr = (addr + count) >> 2;
	if (lstpad == 4) {
		lstpad = 0;
		end_dwaddr--;
	}

	for (dwaddr = start_dwaddr; dwaddr <= end_dwaddr; dwaddr++) {
		len = 4;
		mask = 0xF;
		data = 0;
		ptr = (uint8_t *)&data;
		if (dwaddr == start_dwaddr && fstpad) {
			mask &= ((0x0F << fstpad) & 0x0F);
			len -= fstpad;
			ptr += fstpad;
		}
		if (dwaddr == end_dwaddr && lstpad) {
			mask &= ((0x0F >> lstpad) & 0x0F);
			len -= lstpad;
		}

		memcpy(ptr, buf, len);

		ret = pcie_cfg_write_dw(ntpc, dwaddr, mask, data);
		if (ret < 0)
			return ret;

		buf += len;
		written += len;
	}

	return written;
}